

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utxo_snapshot.h
# Opt level: O0

void __thiscall
node::SnapshotMetadata::SnapshotMetadata
          (SnapshotMetadata *this,MessageStartChars network_magic,uint256 *base_blockhash,
          uint64_t coins_count)

{
  long lVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined8 in_RCX;
  allocator_type *in_RDX;
  undefined4 in_ESI;
  less<unsigned_short> *in_RDI;
  long in_FS_OFFSET;
  initializer_list<unsigned_short> in_stack_00000000;
  allocator<unsigned_short> *in_stack_ffffffffffffff98;
  less<unsigned_short> *__comp;
  undefined2 in_stack_fffffffffffffff0;
  undefined2 uVar9;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar9 = 2;
  __comp = in_RDI;
  std::allocator<unsigned_short>::allocator(in_stack_ffffffffffffff98);
  std::set<unsigned_short,_std::less<unsigned_short>,_std::allocator<unsigned_short>_>::set
            ((set<unsigned_short,_std::less<unsigned_short>,_std::allocator<unsigned_short>_> *)
             CONCAT44(in_ESI,CONCAT22(uVar9,in_stack_fffffffffffffff0)),in_stack_00000000,__comp,
             in_RDX);
  std::allocator<unsigned_short>::~allocator(in_stack_ffffffffffffff98);
  *(undefined4 *)(in_RDI + 0x30) = in_ESI;
  uVar2 = *(undefined4 *)in_RDX;
  uVar3 = *(undefined4 *)(in_RDX + 4);
  uVar4 = *(undefined4 *)(in_RDX + 8);
  uVar5 = *(undefined4 *)(in_RDX + 0xc);
  uVar6 = *(undefined4 *)(in_RDX + 0x14);
  uVar7 = *(undefined4 *)(in_RDX + 0x18);
  uVar8 = *(undefined4 *)(in_RDX + 0x1c);
  *(undefined4 *)(in_RDI + 0x44) = *(undefined4 *)(in_RDX + 0x10);
  *(undefined4 *)(in_RDI + 0x48) = uVar6;
  *(undefined4 *)(in_RDI + 0x4c) = uVar7;
  *(undefined4 *)(in_RDI + 0x50) = uVar8;
  *(undefined4 *)(in_RDI + 0x34) = uVar2;
  *(undefined4 *)(in_RDI + 0x38) = uVar3;
  *(undefined4 *)(in_RDI + 0x3c) = uVar4;
  *(undefined4 *)(in_RDI + 0x40) = uVar5;
  *(undefined8 *)(in_RDI + 0x58) = in_RCX;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

SnapshotMetadata(
        const MessageStartChars network_magic,
        const uint256& base_blockhash,
        uint64_t coins_count) :
            m_network_magic(network_magic),
            m_base_blockhash(base_blockhash),
            m_coins_count(coins_count) { }